

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O2

void __thiscall thread_pool::worker(thread_pool *this)

{
  function<void_()> *__x;
  function<void_()> func;
  unique_lock<std::mutex> lock;
  
  while (((this->m_running)._M_base._M_i & 1U) != 0) {
    func.super__Function_base._M_manager = (_Manager_type)0x0;
    func._M_invoker = (_Invoker_type)0x0;
    func.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    func.super__Function_base._M_functor._8_8_ = 0;
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_mutex);
    std::condition_variable::wait<thread_pool::worker()::_lambda()_1_>
              (&this->m_cv,&lock,(anon_class_8_1_8991fb9c)this);
    __x = (this->m_work).c.
          super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
    if ((this->m_work).c.
        super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != __x) {
      std::function<void_()>::operator=(&func,__x);
      this->m_doingWork = this->m_doingWork + 1;
      std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::pop_front
                (&(this->m_work).c);
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    if (func.super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&func);
    }
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_mutex);
    this->m_doingWork = this->m_doingWork + -1;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    std::_Function_base::~_Function_base(&func.super__Function_base);
  }
  return;
}

Assistant:

void worker() {
    while (m_running) {
      std::function<void()> func;
      {
        std::unique_lock<std::mutex> lock(m_mutex);
        m_cv.wait(lock, [this]() -> bool {
                          return !m_running || !m_work.empty();
                        });
        if (!m_work.empty()) {
          func = std::move(m_work.front());
          ++m_doingWork;
          m_work.pop();
        }
      }
      try {
        if (func)
          func();
      }
      // TODO handle exceptions in a better way
      catch (const std::exception& e) {
        assert(false);
      }
      catch (...) {
        assert(false);
      }

      {
        std::unique_lock<std::mutex> lock(m_mutex);
        --m_doingWork;
        m_cvWait.notify_all();
      }
    }
  }